

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.cpp
# Opt level: O1

bool __thiscall HashTable<int>::Insert(HashTable<int> *this,int value,int address)

{
  Node *pNVar1;
  node *pnVar2;
  
  pNVar1 = this->HashArray;
  pnVar2 = pNVar1 + address;
  if (pNVar1[address].value == 9999999) {
    pNVar1[address].key = address;
    pNVar1[address].value = value;
    pNVar1[address].next = (node *)0x0;
  }
  else {
    do {
      pNVar1 = pnVar2;
      pnVar2 = pNVar1->next;
    } while (pnVar2 != (node *)0x0);
    pnVar2 = (node *)operator_new(0x10);
    pnVar2->key = address;
    pnVar2->value = value;
    pnVar2->next = (node *)0x0;
    pNVar1->next = pnVar2;
  }
  return true;
}

Assistant:

bool Insert(DataType value, int address) {
		//哈希数组为空
		if (HashArray[address].value == MyNull) {
			HashArray[address].key = address;
			HashArray[address].value = value;
			HashArray[address].next = NULL;
		}
		else {   //数组中已被占用，用链址法构建单链表
			Node *p = &HashArray[address];

			while (p->next != NULL)
				p = p->next;

			Node *newNode = new Node;
			newNode->key = address;
			newNode->value = value;
			newNode->next = NULL;

			p->next = newNode;
		}
		return true;
	}